

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
       *this)

{
  bool bVar1;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  if (((this->position).chars_read_total != 0) || (bVar1 = skip_bom(this), bVar1)) {
    do {
      get(this);
      bVar1 = true;
      if (((this->current != 0x20) && (bVar1 = true, this->current != 9)) &&
         (bVar1 = true, this->current != 10)) {
        bVar1 = this->current == 0xd;
      }
    } while (bVar1);
    switch(this->current) {
    default:
      this->error_message = "invalid literal";
      this_local._4_4_ = parse_error;
      break;
    case 0x22:
      this_local._4_4_ = scan_string(this);
      break;
    case 0x2c:
      this_local._4_4_ = value_separator;
      break;
    case 0x2d:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      this_local._4_4_ = scan_number(this);
      break;
    case 0x3a:
      this_local._4_4_ = name_separator;
      break;
    case 0x5b:
      this_local._4_4_ = begin_array;
      break;
    case 0x5d:
      this_local._4_4_ = end_array;
      break;
    case 0x66:
      this_local._4_4_ = scan_literal(this,"false",5,literal_false);
      break;
    case 0x6e:
      this_local._4_4_ = scan_literal(this,"null",4,literal_null);
      break;
    case 0x74:
      this_local._4_4_ = scan_literal(this,"true",4,literal_true);
      break;
    case 0x7b:
      this_local._4_4_ = begin_object;
      break;
    case 0x7d:
      this_local._4_4_ = end_object;
      break;
    case -1:
    case 0:
      this_local._4_4_ = end_of_input;
    }
  }
  else {
    this->error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
    this_local._4_4_ = parse_error;
  }
  return this_local._4_4_;
}

Assistant:

token_type scan()
    {
        // initially, skip the BOM
        if (position.chars_read_total == 0 and not skip_bom())
        {
            error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
            return token_type::parse_error;
        }

        // read next character and ignore whitespace
        do
        {
            get();
        }
        while (current == ' ' or current == '\t' or current == '\n' or current == '\r');

        switch (current)
        {
            // structural characters
            case '[':
                return token_type::begin_array;
            case ']':
                return token_type::end_array;
            case '{':
                return token_type::begin_object;
            case '}':
                return token_type::end_object;
            case ':':
                return token_type::name_separator;
            case ',':
                return token_type::value_separator;

            // literals
            case 't':
                return scan_literal("true", 4, token_type::literal_true);
            case 'f':
                return scan_literal("false", 5, token_type::literal_false);
            case 'n':
                return scan_literal("null", 4, token_type::literal_null);

            // string
            case '\"':
                return scan_string();

            // number
            case '-':
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                return scan_number();

            // end of input (the null byte is needed when parsing from
            // string literals)
            case '\0':
            case std::char_traits<char>::eof():
                return token_type::end_of_input;

            // error
            default:
                error_message = "invalid literal";
                return token_type::parse_error;
        }
    }